

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_set.h
# Opt level: O0

void __thiscall
embree::parallel_set<unsigned_int>::init<std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (parallel_set<unsigned_int> *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *in)

{
  undefined1 uVar1;
  runtime_error *this_00;
  allocator_type *__a;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> temp;
  task_group_context context;
  uintptr_t in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffea8;
  kind_type relation_with_parent;
  task_group_context *in_stack_fffffffffffffeb0;
  anon_class_8_1_898bcfc2 *in_stack_fffffffffffffeb8;
  undefined1 *__n;
  blocked_range<unsigned_long> *in_stack_fffffffffffffec0;
  size_t in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  uint *in_stack_fffffffffffffee0;
  undefined1 local_109 [25];
  undefined1 local_f0 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_e0;
  undefined1 *local_d0;
  blocked_range<unsigned_long> local_b8 [6];
  undefined1 *local_20;
  size_type local_18;
  unsigned_long local_10;
  unsigned_long local_8;
  
  relation_with_parent = (kind_type)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  local_e0 = in_RSI;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RSI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffec0,
             (size_type)in_stack_fffffffffffffeb8);
  local_10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_e0);
  local_e8 = local_e0;
  local_8 = 0;
  local_18 = 0x4000;
  local_20 = local_f0;
  tbb::detail::d1::task_group_context::task_group_context
            (in_stack_fffffffffffffeb0,relation_with_parent,in_stack_fffffffffffffea0);
  tbb::detail::d1::blocked_range<unsigned_long>::blocked_range(local_b8,local_8,local_10,local_18);
  local_d0 = local_20;
  tbb::detail::d1::
  parallel_for<tbb::detail::d1::blocked_range<unsigned_long>,embree::parallel_for<unsigned_long,embree::parallel_set<unsigned_int>::init<std::vector<unsigned_int,std::allocator<unsigned_int>>>(std::vector<unsigned_int,std::allocator<unsigned_int>>const&)::_lambda(embree::range<unsigned_long>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::parallel_set<unsigned_int>::init<std::vector<unsigned_int,std::allocator<unsigned_int>>>(std::vector<unsigned_int,std::allocator<unsigned_int>>const&)::_lambda(embree::range<unsigned_long>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&)_1_>
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  uVar1 = tbb::detail::d1::task_group_context::is_group_execution_cancelled
                    ((task_group_context *)0x1efc6b);
  if (!(bool)uVar1) {
    tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)0x1efd1b);
    __a = (allocator_type *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_e0)
    ;
    __n = local_109;
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x1efd3c);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffec0,
               (size_type)__n,__a);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x1efd5c);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1efd66);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1efd75);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDI);
    radix_sort<unsigned_int>
              (in_stack_fffffffffffffee0,(uint *)in_RDI,CONCAT17(uVar1,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffec8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__a);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"task cancelled");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void init(const Vector& in) 
    {
      /* copy data to internal vector */
      vec.resize(in.size());
      parallel_for( size_t(0), in.size(), size_t(4*4096), [&](const range<size_t>& r) {
	for (size_t i=r.begin(); i<r.end(); i++) 
	  vec[i] = in[i];
      });

      /* sort the data */
      std::vector<T> temp(in.size());
      radix_sort<T>(vec.data(),temp.data(),vec.size());
    }